

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Write3dmHatchPatternComponent
          (ON_BinaryArchive *this,ON_ModelComponent *model_component)

{
  ON_HatchPattern *pattern;
  ON_HatchPattern *hatch_pattern;
  bool rc;
  ON_ModelComponent *model_component_local;
  ON_BinaryArchive *this_local;
  
  hatch_pattern._7_1_ = false;
  pattern = ON_HatchPattern::Cast(&model_component->super_ON_Object);
  if (pattern == (ON_HatchPattern *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2cba,"","model_component parameter is not a hatch pattern component.");
  }
  else {
    hatch_pattern._7_1_ = Write3dmHatchPattern(this,pattern);
  }
  return hatch_pattern._7_1_;
}

Assistant:

bool ON_BinaryArchive::Write3dmHatchPatternComponent(
  const ON_ModelComponent* model_component
  )
{
  bool rc = false;
  for (;;)
  {
    const ON_HatchPattern* hatch_pattern = ON_HatchPattern::Cast(model_component);
    if (nullptr == hatch_pattern)
    {
      ON_ERROR("model_component parameter is not a hatch pattern component.");
      break;
    }
    rc = Write3dmHatchPattern(*hatch_pattern);
    break;
  }
  return rc;
}